

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<long_double> *this;
  SesquickselectK2<long_double> *this_00;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  uint local_1d0;
  allocator<long_double> local_1c9;
  int r;
  vector<long_double,_std::allocator<long_double>_> f;
  value_type_conflict2 local_1a8;
  undefined1 local_190 [8];
  vector<long_double,_std::allocator<long_double>_> fOld;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string filename;
  QuickselectParams<long_double> *pParams;
  double initValue;
  uint nIterations;
  uint nSamples;
  
  this_00 = (SesquickselectK2<long_double> *)operator_new(0x20);
  *(undefined8 *)&this_00->nuStar = 0;
  *(undefined8 *)((long)&this_00->nuStar + 8) = 0;
  (this_00->super_QuickselectParams<long_double>)._vptr_QuickselectParams = (_func_int **)0x0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  SesquickselectK2<long_double>::SesquickselectK2(this_00);
  filename.field_2._8_8_ = this_00;
  (*(this_00->super_QuickselectParams<long_double>)._vptr_QuickselectParams[2])();
  std::operator+(&local_e8,&local_108,"-samples");
  std::__cxx11::to_string(&local_138,200);
  std::operator+(&local_c8,&local_e8,&local_138);
  std::operator+(&local_a8,&local_c8,"-iter");
  std::__cxx11::to_string(&local_158,0x32);
  std::operator+(&local_88,&local_a8,&local_158);
  std::operator+(&local_68,&local_88,"-init");
  std::__cxx11::to_string
            ((string *)
             &fOld.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fOld.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &fOld.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  local_1a8._0_10_ = (longdouble)1.0;
  this = (allocator<long_double> *)
         ((long)&f.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<long_double>::allocator(this);
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)local_190,200,&local_1a8,this);
  std::allocator<long_double>::~allocator
            ((allocator<long_double> *)
             ((long)&f.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<long_double>::allocator(&local_1c9);
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)&r,200,&local_1c9);
  std::allocator<long_double>::~allocator(&local_1c9);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_1d0 = 1; local_1d0 < 0x33; local_1d0 = local_1d0 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Running Iteration ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d0);
    poVar1 = std::operator<<(poVar1," ...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    integralEquationIteration<long_double>
              ((QuickselectParams<long_double> *)filename.field_2._8_8_,
               (vector<long_double,_std::allocator<long_double>_> *)local_190,
               (vector<long_double,_std::allocator<long_double>_> *)&r);
    std::swap<long_double,std::allocator<long_double>>
              ((vector<long_double,_std::allocator<long_double>_> *)local_190,
               (vector<long_double,_std::allocator<long_double>_> *)&r);
    printXYAsMathematicaList<long_double>((vector<long_double,_std::allocator<long_double>_> *)&r);
  }
  std::operator+(&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 ".tab");
  writeXYtoTableFile<long_double>
            ((vector<long_double,_std::allocator<long_double>_> *)&r,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)&r);
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)local_190);
  std::__cxx11::string::~string((string *)local_48);
  return 0;
}

Assistant:

int main() {
	unsigned int nSamples = 200;
	unsigned int nIterations = 50;
	double initValue = 1;

	// SELECT ALGORITHM HERE
	// default: sesquickselect with optimal cutoff, costs are scanned elements
	QuickselectParams<num> * pParams = new SesquickselectK2<num> {};

	string filename = pParams->name()
	                  + "-samples" + to_string(nSamples)
	                  + "-iter" + to_string(nIterations)
	                  + "-init" + to_string(initValue);
	vector<num> fOld(nSamples, initValue), f(nSamples);
	std::cout << filename << std::endl;
	for (int r = 1; r <= nIterations; ++r) {
		cout << "Running Iteration " << r << " ..." << endl;
		integralEquationIteration(pParams, fOld, f);
		swap(fOld, f); // yes, expensive copy, but s dominated by above computations anyway ...
		printXYAsMathematicaList(f);
	}
	writeXYtoTableFile(f, filename + ".tab");

	return 0;
}